

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pd~.c
# Opt level: O0

void pd_tilde_pdtilde(t_pd_tilde *x,t_symbol *s,int argc,t_atom *argv)

{
  char *patchdir_c;
  int iVar1;
  int iVar2;
  t_symbol *ptVar3;
  t_symbol *ptVar4;
  size_t sVar5;
  t_symbol *local_840;
  t_symbol *sym;
  char local_828 [4];
  int l;
  char scheddirstring [1000];
  char *pds;
  char pdargstring [1000];
  char *patchdir;
  t_symbol *schedlibdir;
  t_symbol *sel;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_pd_tilde *x_local;
  
  if ((argc < 1) || (argv->a_type != A_SYMBOL)) {
    local_840 = gensym("?");
  }
  else {
    local_840 = (argv->a_w).w_symbol;
  }
  ptVar3 = gensym("start");
  if (local_840 == ptVar3) {
    if (x->x_infd != (FILE *)0x0) {
      pd_tilde_close(x);
    }
    ptVar3 = canvas_getdir(x->x_canvas);
    patchdir_c = ptVar3->s_name;
    patchdir = (char *)x->x_schedlibdir;
    ptVar3 = gensym(".");
    if (((t_symbol *)patchdir == ptVar3) &&
       (ptVar3 = x->x_pddir, ptVar4 = gensym("."), ptVar3 != ptVar4)) {
      scheddirstring._992_8_ = x->x_pddir->s_name;
      sVar5 = strlen((char *)scheddirstring._992_8_);
      iVar2 = (int)sVar5;
      if ((iVar2 < 4) ||
         ((iVar1 = strcmp((char *)(scheddirstring._992_8_ + (long)iVar2 + -3),"bin"), iVar1 != 0 &&
          (iVar2 = strcmp((char *)(scheddirstring._992_8_ + (long)iVar2 + -4),"bin/"), iVar2 != 0)))
         ) {
        snprintf(local_828,1000,"%s/extra/pd~",scheddirstring._992_8_);
      }
      else {
        snprintf(local_828,1000,"%s/../extra/pd~",scheddirstring._992_8_);
      }
      patchdir = (char *)gensym(local_828);
    }
    pd_tilde_dostart(x,x->x_pddir->s_name,*(char **)patchdir,patchdir_c,argc + -1,argv + 1,
                     x->x_ninsig,x->x_noutsig,x->x_fifo,x->x_sr);
  }
  else {
    ptVar3 = gensym("stop");
    if (local_840 == ptVar3) {
      if (x->x_infd != (FILE *)0x0) {
        pd_tilde_close(x);
      }
    }
    else {
      ptVar3 = gensym("pddir");
      if (local_840 == ptVar3) {
        if ((argc < 2) || (argv[1].a_type != A_SYMBOL)) {
          pd_error(x,"pd~ pddir: needs symbol argument");
        }
        else {
          x->x_pddir = (t_symbol *)argv[1].a_w;
        }
      }
      else {
        pd_error(x,"pd~: unknown control message: %s",local_840->s_name);
      }
    }
  }
  return;
}

Assistant:

static void pd_tilde_pdtilde(t_pd_tilde *x, t_symbol *s,
    int argc, t_atom *argv)
{
    t_symbol *sel = ((argc > 0 && argv->a_type == A_SYMBOL) ?
        argv->a_w.w_symbol : gensym("?")), *schedlibdir;
    const char *patchdir;

    if (sel == gensym("start"))
    {
        char pdargstring[MAXPDSTRING];
#ifdef MAX
    critical_enter(0);
#endif
        if (x->x_infd)
            pd_tilde_close(x);
#ifdef MAX
    critical_exit(0);
#endif
        pdargstring[0] = 0;
        argc--; argv++;
#ifdef PD
        patchdir = canvas_getdir(x->x_canvas)->s_name;
#endif
#ifdef MSP
        patchdir = ".";
#endif
        schedlibdir = x->x_schedlibdir;
        if (schedlibdir == gensym(".") && x->x_pddir != gensym("."))
        {
            const char *pds = x->x_pddir->s_name;
            char scheddirstring[MAXPDSTRING];
            int l = strlen(pds);
            if (l >= 4 && (!strcmp(pds+l-3, "bin") || !strcmp(pds+l-4, "bin/")))
                snprintf(scheddirstring, MAXPDSTRING, "%s/../extra/pd~", pds);
            else snprintf(scheddirstring, MAXPDSTRING, "%s/extra/pd~", pds);
            schedlibdir = gensym(scheddirstring);
        }
        pd_tilde_dostart(x, x->x_pddir->s_name, schedlibdir->s_name,
            patchdir, argc, argv, x->x_ninsig, x->x_noutsig, x->x_fifo,
                x->x_sr);
    }
    else if (sel == gensym("stop"))
    {
#ifdef MAX
    critical_enter(0);
#endif
        if (x->x_infd)
            pd_tilde_close(x);
#ifdef MAX
    critical_exit(0);
#endif
    }
    else if (sel == gensym("pddir"))
    {
        if ((argc > 1) && argv[1].a_type == A_SYMBOL)
        {
            t_symbol *sym = argv[1].a_w.w_symbol;
#ifdef MSP
            if (sym->s_name[0] == ':')
                sym = gensym(s->s_name+1);
#endif
            x->x_pddir = sym;
        }
        else PDERROR "pd~ pddir: needs symbol argument");
    }
    else PDERROR "pd~: unknown control message: %s", sel->s_name);
}